

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderingParameters.hpp
# Opt level: O1

Matrix4f * __thiscall
eos::fitting::RenderingParameters::get_modelview
          (Matrix4f *__return_storage_ptr__,RenderingParameters *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  DenseStorage<float,_16,_4,_4,_0> *pDVar3;
  float fVar5;
  float fVar6;
  undefined1 auVar4 [16];
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  
  if (this->camera_type == Orthographic) {
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[1] = 0.0;
    (pDVar3->m_data).array[2] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[3] = 0.0;
    (pDVar3->m_data).array[4] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[6] = 0.0;
    (pDVar3->m_data).array[7] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[8] = 0.0;
    (pDVar3->m_data).array[9] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[10] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[0xb] = 0.0;
    (pDVar3->m_data).array[0xc] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[0xd] = 0.0;
    (pDVar3->m_data).array[0xe] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xf] = 1.0;
    auVar4 = *(undefined1 (*) [16])
              (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array;
    fVar8 = auVar4._12_4_ * auVar4._12_4_ + auVar4._4_4_ * auVar4._4_4_ +
            auVar4._8_4_ * auVar4._8_4_ + auVar4._0_4_ * auVar4._0_4_;
    if (0.0 < fVar8) {
      fVar8 = SQRT(fVar8);
      auVar2._4_4_ = fVar8;
      auVar2._0_4_ = fVar8;
      auVar2._8_4_ = fVar8;
      auVar2._12_4_ = fVar8;
      auVar4 = divps(auVar4,auVar2);
    }
    fVar8 = auVar4._0_4_;
    fVar5 = auVar4._4_4_;
    fVar6 = auVar4._8_4_;
    fVar7 = auVar4._12_4_;
    fVar10 = fVar5 + fVar5;
    fVar12 = fVar6 + fVar6;
    fVar11 = fVar7 * (fVar8 + fVar8);
    fVar9 = (fVar8 + fVar8) * fVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 1.0 - (fVar10 * fVar5 + fVar12 * fVar6);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[1] = fVar8 * fVar10 + fVar7 * fVar12;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[2] = fVar8 * fVar12 - fVar7 * fVar10;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[4] = fVar8 * fVar10 - fVar7 * fVar12;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 1.0 - (fVar12 * fVar6 + fVar9);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[6] = fVar5 * fVar12 + fVar11;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[8] = fVar8 * fVar12 + fVar7 * fVar10;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[9] = fVar5 * fVar12 - fVar11;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[10] = 1.0 - (fVar10 * fVar5 + fVar9);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xc] = this->t_x;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xd] = this->t_y;
  }
  else {
    if ((this->t_z).super__Optional_base<float,_true,_true>._M_payload.
        super__Optional_payload_base<float>._M_engaged == false) {
      __assert_fail("t_z.has_value()",
                    "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/fitting/RenderingParameters.hpp"
                    ,0xe7,"Eigen::Matrix4f eos::fitting::RenderingParameters::get_modelview() const"
                   );
    }
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[1] = 0.0;
    (pDVar3->m_data).array[2] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[3] = 0.0;
    (pDVar3->m_data).array[4] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[6] = 0.0;
    (pDVar3->m_data).array[7] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[8] = 0.0;
    (pDVar3->m_data).array[9] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[10] = 1.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[0xb] = 0.0;
    (pDVar3->m_data).array[0xc] = 0.0;
    pDVar3 = &(__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
              m_storage;
    (pDVar3->m_data).array[0xd] = 0.0;
    (pDVar3->m_data).array[0xe] = 0.0;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xf] = 1.0;
    auVar4 = *(undefined1 (*) [16])
              (this->rotation).m_coeffs.super_PlainObjectBase<Eigen::Matrix<float,_4,_1,_0,_4,_1>_>.
              m_storage.m_data.array;
    fVar8 = auVar4._12_4_ * auVar4._12_4_ + auVar4._4_4_ * auVar4._4_4_ +
            auVar4._8_4_ * auVar4._8_4_ + auVar4._0_4_ * auVar4._0_4_;
    if (0.0 < fVar8) {
      fVar8 = SQRT(fVar8);
      auVar1._4_4_ = fVar8;
      auVar1._0_4_ = fVar8;
      auVar1._8_4_ = fVar8;
      auVar1._12_4_ = fVar8;
      auVar4 = divps(auVar4,auVar1);
    }
    fVar8 = auVar4._0_4_;
    fVar5 = auVar4._4_4_;
    fVar6 = auVar4._8_4_;
    fVar7 = auVar4._12_4_;
    fVar10 = fVar5 + fVar5;
    fVar12 = fVar6 + fVar6;
    fVar11 = fVar7 * (fVar8 + fVar8);
    fVar9 = (fVar8 + fVar8) * fVar8;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0] = 1.0 - (fVar10 * fVar5 + fVar12 * fVar6);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[1] = fVar8 * fVar10 + fVar7 * fVar12;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[2] = fVar8 * fVar12 - fVar7 * fVar10;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[4] = fVar8 * fVar10 - fVar7 * fVar12;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[5] = 1.0 - (fVar12 * fVar6 + fVar9);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[6] = fVar5 * fVar12 + fVar11;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[8] = fVar8 * fVar12 + fVar7 * fVar10;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[9] = fVar5 * fVar12 - fVar11;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[10] = 1.0 - (fVar10 * fVar5 + fVar9);
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xc] = this->t_x;
    (__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).m_storage.
    m_data.array[0xd] = this->t_y;
    *(_Storage<float,_true> *)
     ((__return_storage_ptr__->super_PlainObjectBase<Eigen::Matrix<float,_4,_4,_0,_4,_4>_>).
      m_storage.m_data.array + 0xe) =
         (this->t_z).super__Optional_base<float,_true,_true>._M_payload.
         super__Optional_payload_base<float>._M_payload;
  }
  return __return_storage_ptr__;
}

Assistant:

Eigen::Matrix4f get_modelview() const
    {
        if (camera_type == CameraType::Orthographic)
        {
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            return modelview;
        } else
        {
            assert(t_z.has_value()); // Might be worth throwing an exception instead.
            Eigen::Matrix4f modelview = Eigen::Matrix4f::Identity();
            modelview.block<3, 3>(0, 0) = rotation.normalized().toRotationMatrix();
            modelview(0, 3) = t_x;
            modelview(1, 3) = t_y;
            modelview(2, 3) = t_z.value();
            return modelview;
        }
    }